

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O0

bool __thiscall ON_PolylineCurve::Reverse(ON_PolylineCurve *this)

{
  int iVar1;
  double *pdVar2;
  int local_24;
  int i;
  double *t;
  int count;
  bool rc;
  ON_PolylineCurve *this_local;
  
  t._7_1_ = false;
  iVar1 = PointCount(this);
  if (1 < iVar1) {
    ON_SimpleArray<ON_3dPoint>::Reverse((ON_SimpleArray<ON_3dPoint> *)&this->m_pline);
    ON_SimpleArray<double>::Reverse(&this->m_t);
    pdVar2 = ON_SimpleArray<double>::Array(&this->m_t);
    for (local_24 = 0; local_24 < iVar1; local_24 = local_24 + 1) {
      pdVar2[local_24] = -pdVar2[local_24];
    }
    t._7_1_ = true;
  }
  ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
  return t._7_1_;
}

Assistant:

bool
ON_PolylineCurve::Reverse()
{
  bool rc = false;
  const int count = PointCount();
  if ( count >= 2 ) {
    m_pline.Reverse();
    m_t.Reverse();
    double* t = m_t.Array();
    for ( int i = 0; i < count; i++ ) {
      t[i] = -t[i];
    }
    rc = true;
  }
	DestroyCurveTree();
  return rc;
}